

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O2

void losespells(void)

{
  long lVar1;
  uint x;
  
  book = (obj *)0x0;
  lVar1 = 0;
  x = 0x2b;
  do {
    if (lVar1 == 0x2b) {
LAB_002394da:
      rnd(x);
      for (lVar1 = -8; lVar1 != 0; lVar1 = lVar1 + 8) {
        *(undefined2 *)((long)&spl_book[x].sp_id + lVar1) = 0;
        exercise(2,'\0');
      }
      return;
    }
    if (spl_book[lVar1].sp_id == 0) {
      if (lVar1 == 0) {
        book = (obj *)0x0;
        return;
      }
      x = (uint)lVar1;
      goto LAB_002394da;
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

void losespells(void)
{
	boolean confused = (Confusion != 0);
	int  n, nzap, i;

	book = 0;
	for (n = 0; n < MAXSPELL && spellid(n) != NO_SPELL; n++)
		continue;
	if (n) {
		nzap = rnd(n) + confused ? 1 : 0;
		if (nzap > n) nzap = n;
		for (i = n - nzap; i < n; i++) {
		    spellid(i) = NO_SPELL;
		    exercise(A_WIS, FALSE);	/* ouch! */
		}
	}
}